

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

void __thiscall QLineEditIconButton::updateCursor(QLineEditIconButton *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = qFuzzyCompare(this->m_opacity,1.0);
  if ((bVar1) ||
     (*(long *)(*(long *)&(this->super_QToolButton).super_QAbstractButton.super_QWidget.field_0x8 +
               0x10) == 0)) {
    QCursor::QCursor((QCursor *)&stack0xffffffffffffffe0,ArrowCursor);
  }
  else {
    QWidget::cursor((QWidget *)&stack0xffffffffffffffe0);
  }
  QWidget::setCursor((QWidget *)this,(QCursor *)&stack0xffffffffffffffe0);
  QCursor::~QCursor((QCursor *)&stack0xffffffffffffffe0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditIconButton::updateCursor()
{
#ifndef QT_NO_CURSOR
    setCursor(qFuzzyCompare(m_opacity, qreal(1.0)) || !parentWidget() ? QCursor(Qt::ArrowCursor) : parentWidget()->cursor());
#endif
}